

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternPainter.cpp
# Opt level: O3

void __thiscall
PatternPainter::drawBackground
          (PatternPainter *this,QPainter *p,PatternLayout *l,int ypos,int rowStart,int rows)

{
  int iVar1;
  Spec SVar2;
  int iVar3;
  QColor local_50;
  array<QColor,_3UL> *local_40;
  QRect *local_38;
  
  local_38 = (QRect *)p;
  iVar1 = CellPainter::cellHeight(&this->super_CellPainter);
  SVar2 = PatternLayout::patternStart(l);
  iVar3 = PatternLayout::rowWidth(l);
  if (0 < rows) {
    local_40 = &this->mBackgroundColors;
    do {
      local_50._12_4_ = iVar1 + -1 + ypos;
      local_50.cspec = SVar2;
      local_50.ct._0_4_ = ypos;
      local_50.ct._4_4_ = SVar2 + iVar3 + -1;
      QPainter::fillRect(local_38,&local_50);
      ypos = ypos + iVar1;
      rows = rows + -1;
    } while (rows != 0);
  }
  return;
}

Assistant:

void PatternPainter::drawBackground(QPainter &p, PatternLayout const& l, int ypos, int rowStart, int rows) const {
    auto const _cellHeight = cellHeight();

    int rowno = rowStart;
    auto const start = l.patternStart();
    auto const _rowWidth = l.rowWidth();
    for (int i = 0; i < rows; ++i) {
        p.fillRect(start, ypos, _rowWidth, _cellHeight, mBackgroundColors[highlightIndex(rowno)]);
        ypos += _cellHeight;
        ++rowno;
    }
}